

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_address.h
# Opt level: O1

void __thiscall
sockpp::sock_address_any::sock_address_any
          (sock_address_any *this,sockaddr_storage *addr,socklen_t n)

{
  length_error *this_00;
  
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__sock_address_0010cbf0;
  (this->addr_).ss_family = 0;
  (this->addr_).__ss_padding[0] = '\0';
  (this->addr_).__ss_padding[1] = '\0';
  (this->addr_).__ss_padding[2] = '\0';
  (this->addr_).__ss_padding[3] = '\0';
  (this->addr_).__ss_padding[4] = '\0';
  (this->addr_).__ss_padding[5] = '\0';
  (this->addr_).__ss_padding[6] = '\0';
  (this->addr_).__ss_padding[7] = '\0';
  (this->addr_).__ss_padding[8] = '\0';
  (this->addr_).__ss_padding[9] = '\0';
  (this->addr_).__ss_padding[10] = '\0';
  (this->addr_).__ss_padding[0xb] = '\0';
  (this->addr_).__ss_padding[0xc] = '\0';
  (this->addr_).__ss_padding[0xd] = '\0';
  (this->addr_).__ss_padding[0xe] = '\0';
  (this->addr_).__ss_padding[0xf] = '\0';
  (this->addr_).__ss_padding[0x10] = '\0';
  (this->addr_).__ss_padding[0x11] = '\0';
  (this->addr_).__ss_padding[0x12] = '\0';
  (this->addr_).__ss_padding[0x13] = '\0';
  (this->addr_).__ss_padding[0x14] = '\0';
  (this->addr_).__ss_padding[0x15] = '\0';
  (this->addr_).__ss_padding[0x16] = '\0';
  (this->addr_).__ss_padding[0x17] = '\0';
  (this->addr_).__ss_padding[0x18] = '\0';
  (this->addr_).__ss_padding[0x19] = '\0';
  (this->addr_).__ss_padding[0x1a] = '\0';
  (this->addr_).__ss_padding[0x1b] = '\0';
  (this->addr_).__ss_padding[0x1c] = '\0';
  (this->addr_).__ss_padding[0x1d] = '\0';
  (this->addr_).__ss_padding[0x1e] = '\0';
  (this->addr_).__ss_padding[0x1f] = '\0';
  (this->addr_).__ss_padding[0x20] = '\0';
  (this->addr_).__ss_padding[0x21] = '\0';
  (this->addr_).__ss_padding[0x22] = '\0';
  (this->addr_).__ss_padding[0x23] = '\0';
  (this->addr_).__ss_padding[0x24] = '\0';
  (this->addr_).__ss_padding[0x25] = '\0';
  (this->addr_).__ss_padding[0x26] = '\0';
  (this->addr_).__ss_padding[0x27] = '\0';
  (this->addr_).__ss_padding[0x28] = '\0';
  (this->addr_).__ss_padding[0x29] = '\0';
  (this->addr_).__ss_padding[0x2a] = '\0';
  (this->addr_).__ss_padding[0x2b] = '\0';
  (this->addr_).__ss_padding[0x2c] = '\0';
  (this->addr_).__ss_padding[0x2d] = '\0';
  (this->addr_).__ss_padding[0x2e] = '\0';
  (this->addr_).__ss_padding[0x2f] = '\0';
  (this->addr_).__ss_padding[0x30] = '\0';
  (this->addr_).__ss_padding[0x31] = '\0';
  (this->addr_).__ss_padding[0x32] = '\0';
  (this->addr_).__ss_padding[0x33] = '\0';
  (this->addr_).__ss_padding[0x34] = '\0';
  (this->addr_).__ss_padding[0x35] = '\0';
  (this->addr_).__ss_padding[0x36] = '\0';
  (this->addr_).__ss_padding[0x37] = '\0';
  (this->addr_).__ss_padding[0x38] = '\0';
  (this->addr_).__ss_padding[0x39] = '\0';
  (this->addr_).__ss_padding[0x3a] = '\0';
  (this->addr_).__ss_padding[0x3b] = '\0';
  (this->addr_).__ss_padding[0x3c] = '\0';
  (this->addr_).__ss_padding[0x3d] = '\0';
  (this->addr_).__ss_padding[0x3e] = '\0';
  (this->addr_).__ss_padding[0x3f] = '\0';
  (this->addr_).__ss_padding[0x40] = '\0';
  (this->addr_).__ss_padding[0x41] = '\0';
  (this->addr_).__ss_padding[0x42] = '\0';
  (this->addr_).__ss_padding[0x43] = '\0';
  (this->addr_).__ss_padding[0x44] = '\0';
  (this->addr_).__ss_padding[0x45] = '\0';
  (this->addr_).__ss_padding[0x46] = '\0';
  (this->addr_).__ss_padding[0x47] = '\0';
  (this->addr_).__ss_padding[0x48] = '\0';
  (this->addr_).__ss_padding[0x49] = '\0';
  (this->addr_).__ss_padding[0x4a] = '\0';
  (this->addr_).__ss_padding[0x4b] = '\0';
  (this->addr_).__ss_padding[0x4c] = '\0';
  (this->addr_).__ss_padding[0x4d] = '\0';
  (this->addr_).__ss_padding[0x4e] = '\0';
  (this->addr_).__ss_padding[0x4f] = '\0';
  (this->addr_).__ss_padding[0x50] = '\0';
  (this->addr_).__ss_padding[0x51] = '\0';
  (this->addr_).__ss_padding[0x52] = '\0';
  (this->addr_).__ss_padding[0x53] = '\0';
  (this->addr_).__ss_padding[0x54] = '\0';
  (this->addr_).__ss_padding[0x55] = '\0';
  (this->addr_).__ss_padding[0x56] = '\0';
  (this->addr_).__ss_padding[0x57] = '\0';
  (this->addr_).__ss_padding[0x58] = '\0';
  (this->addr_).__ss_padding[0x59] = '\0';
  (this->addr_).__ss_padding[0x5a] = '\0';
  (this->addr_).__ss_padding[0x5b] = '\0';
  (this->addr_).__ss_padding[0x5c] = '\0';
  (this->addr_).__ss_padding[0x5d] = '\0';
  (this->addr_).__ss_padding[0x5e] = '\0';
  (this->addr_).__ss_padding[0x5f] = '\0';
  (this->addr_).__ss_padding[0x60] = '\0';
  (this->addr_).__ss_padding[0x61] = '\0';
  (this->addr_).__ss_padding[0x62] = '\0';
  (this->addr_).__ss_padding[99] = '\0';
  (this->addr_).__ss_padding[100] = '\0';
  (this->addr_).__ss_padding[0x65] = '\0';
  (this->addr_).__ss_padding[0x66] = '\0';
  (this->addr_).__ss_padding[0x67] = '\0';
  (this->addr_).__ss_padding[0x68] = '\0';
  (this->addr_).__ss_padding[0x69] = '\0';
  (this->addr_).__ss_padding[0x6a] = '\0';
  (this->addr_).__ss_padding[0x6b] = '\0';
  (this->addr_).__ss_padding[0x6c] = '\0';
  (this->addr_).__ss_padding[0x6d] = '\0';
  (this->addr_).__ss_padding[0x6e] = '\0';
  (this->addr_).__ss_padding[0x6f] = '\0';
  (this->addr_).__ss_padding[0x70] = '\0';
  (this->addr_).__ss_padding[0x71] = '\0';
  (this->addr_).__ss_padding[0x72] = '\0';
  (this->addr_).__ss_padding[0x73] = '\0';
  (this->addr_).__ss_padding[0x74] = '\0';
  (this->addr_).__ss_padding[0x75] = '\0';
  (this->addr_).__ss_align = 0;
  this->sz_ = 0x80;
  if (n < 0x81) {
    this->sz_ = n;
    memcpy(&this->addr_,addr,(ulong)n);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"Address length out of range");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

sock_address_any(const sockaddr_storage& addr, socklen_t n) {
        if (size_t(n) > MAX_SZ)
            throw std::length_error("Address length out of range");
        std::memcpy(&addr_, &addr, sz_ = n);
    }